

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_buffermgr.cc
# Opt level: O2

RC __thiscall PF_BufferMgr::PrintBuffer(PF_BufferMgr *this)

{
  int iVar1;
  ostream *poVar2;
  int iVar3;
  char *pcVar4;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Buffer contains ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->numPages);
  poVar2 = std::operator<<(poVar2," pages of size ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->pageSize);
  std::operator<<(poVar2,".\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"Contents in order from most recently used to ");
  std::operator<<(poVar2,"least recently used.\n");
  iVar3 = this->first;
  while (iVar3 != -1) {
    iVar1 = this->bufTable[iVar3].next;
    poVar2 = (ostream *)std::ostream::operator<<(&std::cout,iVar3);
    std::operator<<(poVar2," :: \n");
    poVar2 = std::operator<<((ostream *)&std::cout,"  fd = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->bufTable[iVar3].fd);
    std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<((ostream *)&std::cout,"  pageNum = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->bufTable[iVar3].pageNum);
    std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<((ostream *)&std::cout,"  bDirty = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->bufTable[iVar3].bDirty);
    std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<((ostream *)&std::cout,"  pinCount = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->bufTable[iVar3].pinCount);
    std::operator<<(poVar2,"\n");
    iVar3 = iVar1;
  }
  pcVar4 = "All remaining slots are free.\n";
  if (this->first == -1) {
    pcVar4 = "Buffer is empty!\n";
  }
  std::operator<<((ostream *)&std::cout,pcVar4);
  return 0;
}

Assistant:

RC PF_BufferMgr::PrintBuffer()
{
   cout << "Buffer contains " << numPages << " pages of size "
      << pageSize <<".\n";
   cout << "Contents in order from most recently used to "
      << "least recently used.\n";

   int slot, next;
   slot = first;
   while (slot != INVALID_SLOT) {
      next = bufTable[slot].next;
      cout << slot << " :: \n";
      cout << "  fd = " << bufTable[slot].fd << "\n";
      cout << "  pageNum = " << bufTable[slot].pageNum << "\n";
      cout << "  bDirty = " << bufTable[slot].bDirty << "\n";
      cout << "  pinCount = " << bufTable[slot].pinCount << "\n";
      slot = next;
   }

   if (first==INVALID_SLOT)
      cout << "Buffer is empty!\n";
   else
      cout << "All remaining slots are free.\n";

   return 0;
}